

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

int mbedtls_internal_sha512_process(mbedtls_sha512_context *ctx,uchar *data)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long alStack_338 [6];
  ulong local_308 [8];
  ulong auStack_2c8 [83];
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_308[lVar1] = ctx->state[lVar1];
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    uVar6 = *(ulong *)(data + lVar1 * 8);
    auStack_2c8[lVar1 + 2] =
         uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
         (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
         (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
  }
  for (lVar1 = 0x10; lVar1 != 0x50; lVar1 = lVar1 + 1) {
    uVar6 = auStack_2c8[lVar1];
    uVar2 = local_308[lVar1 + -5];
    auStack_2c8[lVar1 + 2] =
         (uVar6 >> 6 ^ (uVar6 << 3 | uVar6 >> 0x3d) ^ (uVar6 << 0x2d | uVar6 >> 0x13)) +
         local_308[lVar1 + 3] + alStack_338[lVar1] +
         (uVar2 >> 7 ^
         (uVar2 << 0x38 | uVar2 >> 8) ^ (uVar2 >> 1 | (ulong)((uVar2 & 1) != 0) << 0x3f));
  }
  uVar6 = 0xfffffffffffffff8;
  do {
    lVar1 = ((local_308[4] << 0x17 | local_308[4] >> 0x29) ^
            (local_308[4] << 0x2e | local_308[4] >> 0x12) ^
            (local_308[4] << 0x32 | local_308[4] >> 0xe)) + local_308[7] + K[uVar6 + 8] +
            auStack_2c8[uVar6 + 10] + ((local_308[5] ^ local_308[6]) & local_308[4] ^ local_308[6]);
    uVar8 = local_308[3] + lVar1;
    uVar7 = ((local_308[1] | local_308[0]) & local_308[2] | local_308[1] & local_308[0]) +
            ((local_308[0] << 0x19 | local_308[0] >> 0x27) ^
            (local_308[0] << 0x1e | local_308[0] >> 0x22) ^
            (local_308[0] << 0x24 | local_308[0] >> 0x1c)) + lVar1;
    lVar1 = ((local_308[5] ^ local_308[4]) & uVar8 ^ local_308[5]) + local_308[6] + K[uVar6 + 9] +
            ((uVar8 * 0x800000 | uVar8 >> 0x29) ^
            (uVar8 << 0x2e | uVar8 >> 0x12) ^ (uVar8 << 0x32 | uVar8 >> 0xe)) +
            auStack_2c8[uVar6 + 0xb];
    uVar10 = local_308[2] + lVar1;
    uVar4 = ((uVar7 | local_308[0]) & local_308[1] | uVar7 & local_308[0]) +
            ((uVar7 * 0x2000000 | uVar7 >> 0x27) ^
            (uVar7 * 0x40000000 | uVar7 >> 0x22) ^ (uVar7 << 0x24 | uVar7 >> 0x1c)) + lVar1;
    lVar1 = local_308[5] + K[uVar6 + 10] + auStack_2c8[uVar6 + 0xc] +
            ((uVar8 ^ local_308[4]) & uVar10 ^ local_308[4]) +
            ((uVar10 * 0x800000 | uVar10 >> 0x29) ^
            (uVar10 << 0x2e | uVar10 >> 0x12) ^ (uVar10 << 0x32 | uVar10 >> 0xe));
    uVar9 = local_308[1] + lVar1;
    uVar2 = lVar1 + ((uVar4 | uVar7) & local_308[0] | uVar4 & uVar7) +
                    ((uVar4 * 0x2000000 | uVar4 >> 0x27) ^
                    (uVar4 * 0x40000000 | uVar4 >> 0x22) ^ (uVar4 << 0x24 | uVar4 >> 0x1c));
    lVar1 = local_308[4] + K[uVar6 + 0xb] + auStack_2c8[uVar6 + 0xd] +
            ((uVar10 ^ uVar8) & uVar9 ^ uVar8) +
            ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
            (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
    uVar5 = local_308[0] + lVar1;
    uVar3 = lVar1 + ((uVar2 | uVar4) & uVar7 | uVar2 & uVar4) +
                    ((uVar2 * 0x2000000 | uVar2 >> 0x27) ^
                    (uVar2 * 0x40000000 | uVar2 >> 0x22) ^ (uVar2 << 0x24 | uVar2 >> 0x1c));
    lVar1 = uVar8 + K[uVar6 + 0xc] + auStack_2c8[uVar6 + 0xe] + ((uVar9 ^ uVar10) & uVar5 ^ uVar10)
            + ((uVar5 * 0x800000 | uVar5 >> 0x29) ^
              (uVar5 << 0x2e | uVar5 >> 0x12) ^ (uVar5 << 0x32 | uVar5 >> 0xe));
    local_308[7] = uVar7 + lVar1;
    local_308[3] = ((uVar3 | uVar2) & uVar4 | uVar3 & uVar2) +
                   ((uVar3 * 0x2000000 | uVar3 >> 0x27) ^
                   (uVar3 * 0x40000000 | uVar3 >> 0x22) ^ (uVar3 << 0x24 | uVar3 >> 0x1c)) + lVar1;
    lVar1 = uVar10 + K[uVar6 + 0xd] + auStack_2c8[uVar6 + 0xf] +
            ((uVar5 ^ uVar9) & local_308[7] ^ uVar9) +
            ((local_308[7] * 0x800000 | local_308[7] >> 0x29) ^
            (local_308[7] << 0x2e | local_308[7] >> 0x12) ^
            (local_308[7] << 0x32 | local_308[7] >> 0xe));
    local_308[6] = uVar4 + lVar1;
    local_308[2] = ((local_308[3] | uVar3) & uVar2 | local_308[3] & uVar3) +
                   ((local_308[3] * 0x2000000 | local_308[3] >> 0x27) ^
                   (local_308[3] * 0x40000000 | local_308[3] >> 0x22) ^
                   (local_308[3] << 0x24 | local_308[3] >> 0x1c)) + lVar1;
    lVar1 = uVar9 + K[uVar6 + 0xe] + auStack_2c8[uVar6 + 0x10] +
            ((local_308[7] ^ uVar5) & local_308[6] ^ uVar5) +
            ((local_308[6] * 0x800000 | local_308[6] >> 0x29) ^
            (local_308[6] << 0x2e | local_308[6] >> 0x12) ^
            (local_308[6] << 0x32 | local_308[6] >> 0xe));
    local_308[5] = uVar2 + lVar1;
    local_308[1] = ((local_308[2] | local_308[3]) & uVar3 | local_308[2] & local_308[3]) +
                   ((local_308[2] * 0x2000000 | local_308[2] >> 0x27) ^
                   (local_308[2] * 0x40000000 | local_308[2] >> 0x22) ^
                   (local_308[2] << 0x24 | local_308[2] >> 0x1c)) + lVar1;
    lVar1 = uVar5 + K[uVar6 + 0xf] + auStack_2c8[uVar6 + 0x11] +
            ((local_308[6] ^ local_308[7]) & local_308[5] ^ local_308[7]) +
            ((local_308[5] * 0x800000 | local_308[5] >> 0x29) ^
            (local_308[5] << 0x2e | local_308[5] >> 0x12) ^
            (local_308[5] << 0x32 | local_308[5] >> 0xe));
    local_308[4] = uVar3 + lVar1;
    local_308[0] = ((local_308[1] | local_308[2]) & local_308[3] | local_308[1] & local_308[2]) +
                   ((local_308[1] * 0x2000000 | local_308[1] >> 0x27) ^
                   (local_308[1] * 0x40000000 | local_308[1] >> 0x22) ^
                   (local_308[1] << 0x24 | local_308[1] >> 0x1c)) + lVar1;
    uVar6 = uVar6 + 8;
  } while (uVar6 < 0x48);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    ctx->state[lVar1] = ctx->state[lVar1] + local_308[lVar1];
  }
  return 0;
}

Assistant:

int mbedtls_internal_sha512_process( mbedtls_sha512_context *ctx,
                                     const unsigned char data[128] )
{
    int i;
    uint64_t temp1, temp2, W[80];
    uint64_t A[8];

    SHA512_VALIDATE_RET( ctx != NULL );
    SHA512_VALIDATE_RET( (const unsigned char *)data != NULL );

#define  SHR(x,n) ((x) >> (n))
#define ROTR(x,n) (SHR((x),(n)) | ((x) << (64 - (n))))

#define S0(x) (ROTR(x, 1) ^ ROTR(x, 8) ^  SHR(x, 7))
#define S1(x) (ROTR(x,19) ^ ROTR(x,61) ^  SHR(x, 6))

#define S2(x) (ROTR(x,28) ^ ROTR(x,34) ^ ROTR(x,39))
#define S3(x) (ROTR(x,14) ^ ROTR(x,18) ^ ROTR(x,41))

#define F0(x,y,z) (((x) & (y)) | ((z) & ((x) | (y))))
#define F1(x,y,z) ((z) ^ ((x) & ((y) ^ (z))))

#define P(a,b,c,d,e,f,g,h,x,K)                                  \
    do                                                          \
    {                                                           \
        temp1 = (h) + S3(e) + F1((e),(f),(g)) + (K) + (x);      \
        temp2 = S2(a) + F0((a),(b),(c));                        \
        (d) += temp1; (h) = temp1 + temp2;                      \
    } while( 0 )

    for( i = 0; i < 8; i++ )
        A[i] = ctx->state[i];

#if defined(MBEDTLS_SHA512_SMALLER)
    for( i = 0; i < 80; i++ )
    {
        if( i < 16 )
        {
            GET_UINT64_BE( W[i], data, i << 3 );
        }
        else
        {
            W[i] = S1(W[i -  2]) + W[i -  7] +
                   S0(W[i - 15]) + W[i - 16];
        }

        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] );

        temp1 = A[7]; A[7] = A[6]; A[6] = A[5]; A[5] = A[4]; A[4] = A[3];
        A[3] = A[2]; A[2] = A[1]; A[1] = A[0]; A[0] = temp1;
    }
#else /* MBEDTLS_SHA512_SMALLER */
    for( i = 0; i < 16; i++ )
    {
        GET_UINT64_BE( W[i], data, i << 3 );
    }

    for( ; i < 80; i++ )
    {
        W[i] = S1(W[i -  2]) + W[i -  7] +
               S0(W[i - 15]) + W[i - 16];
    }

    i = 0;
    do
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] ); i++;
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i], K[i] ); i++;
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i], K[i] ); i++;
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i], K[i] ); i++;
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i], K[i] ); i++;
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i], K[i] ); i++;
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i], K[i] ); i++;
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i], K[i] ); i++;
    }
    while( i < 80 );
#endif /* MBEDTLS_SHA512_SMALLER */

    for( i = 0; i < 8; i++ )
        ctx->state[i] += A[i];

    return( 0 );
}